

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

void __thiscall
QFileSystemModelPrivate::fileSystemChanged
          (QFileSystemModelPrivate *this,QString *path,
          QList<std::pair<QString,_QFileInfo>_> *updates)

{
  QModelIndex *pQVar1;
  bool bVar2;
  int iVar3;
  uint row;
  int iVar4;
  int iVar5;
  QFileSystemNode *parentNode;
  iterator iVar6;
  iterator iVar7;
  pair<QString,_QFileInfo> *update;
  pair<QString,_QFileInfo> *ppVar8;
  QFileSystemModelPrivate *this_00;
  QArrayDataPointer<QString> *this_01;
  QString *value;
  QString *pQVar9;
  long lVar10;
  long in_FS_OFFSET;
  QFileSystemNode *node;
  QArrayDataPointer<int> local_148;
  undefined1 *local_128;
  undefined1 *puStack_120;
  undefined1 *local_118;
  undefined1 local_108 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_f8;
  undefined1 local_e8 [48];
  QArrayDataPointer<char16_t> local_b8;
  undefined1 local_98 [16];
  undefined1 *local_88;
  QArrayDataPointer<QString> local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QModelIndex **)&this->field_0x8;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  local_78.size = 0;
  parentNode = QFileSystemModelPrivate::node(this,path,false);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  index((QFileSystemModelPrivate *)local_98,(char *)this,(int)parentNode);
  ppVar8 = (updates->d).ptr;
  lVar10 = (updates->d).size << 5;
  do {
    if (lVar10 == 0) {
      iVar6 = QList<QString>::begin((QList<QString> *)&local_58);
      iVar7 = QList<QString>::end((QList<QString> *)&local_58);
      std::__sort<QList<QString>::iterator,__gnu_cxx::__ops::_Iter_less_iter>(iVar6.i,iVar7.i);
      local_e8._0_8_ = (Data *)0x0;
      local_e8._8_8_ = (char16_t *)0x0;
      local_e8._16_8_ = 0;
      local_b8.size = 0;
      local_b8.d = (Data *)0x0;
      local_b8.ptr = (char16_t *)0x0;
      pQVar9 = local_58.ptr;
      for (lVar10 = local_58.size * 0x18; lVar10 != 0; lVar10 = lVar10 + -0x18) {
        QString::operator=((QString *)&local_b8,(QString *)pQVar9);
        QString::operator=((QString *)local_e8,(QString *)pQVar9);
        row = QFileSystemNode::visibleLocation(parentNode,(QString *)local_e8);
        iVar3 = QFileSystemNode::visibleLocation(parentNode,(QString *)&local_b8);
        if ((((-1 < (int)row) && ((ulong)row < (ulong)(parentNode->visibleChildren).d.size)) &&
            (bVar2 = ::comparesEqual((parentNode->visibleChildren).d.ptr + row,(QString *)local_e8),
            -1 < iVar3)) && (bVar2)) {
          iVar4 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,local_98);
          local_f8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_108._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          iVar5 = translateVisibleLocation(this,parentNode,row);
          (**(code **)(*(long *)pQVar1 + 0x60))(local_108,pQVar1,iVar5,0,local_98);
          local_118 = &DAT_aaaaaaaaaaaaaaaa;
          local_128 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
          iVar3 = translateVisibleLocation(this,parentNode,iVar3);
          (**(code **)(*(long *)pQVar1 + 0x60))(&local_128,pQVar1,iVar3,iVar4 + -1,local_98);
          local_148.d = (Data *)0x0;
          local_148.ptr = (int *)0x0;
          local_148.size = 0;
          QAbstractItemModel::dataChanged
                    (pQVar1,(QModelIndex *)local_108,(QList_conflict1 *)&local_128);
          QArrayDataPointer<int>::~QArrayDataPointer(&local_148);
        }
        pQVar9 = pQVar9 + 1;
      }
      if (((local_78.size != 0) &&
          (addVisibleFiles(this,parentNode,(QStringList *)&local_78), local_78.size != 0)) ||
         ((this->sortColumn != 0 && (local_58.size != 0)))) {
        this->forceSort = true;
        delayedSort(this);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_e8);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    local_b8.d = (ppVar8->first).d.d;
    local_b8.ptr = (ppVar8->first).d.ptr;
    local_b8.size = (ppVar8->first).d.size;
    if (local_b8.d != (Data *)0x0) {
      LOCK();
      ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_e8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_e8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileInfoGatherer::getInfo
              ((QExtendedInformation *)local_e8,
               (QFileInfoGatherer *)
               (this->fileInfoGatherer)._M_t.
               super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>.
               _M_t.
               super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>.
               super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl,&ppVar8->second);
    bVar2 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::contains
                      (&parentNode->children,(QString *)&local_b8);
    if (!bVar2) {
      this_00 = (QFileSystemModelPrivate *)local_108;
      QFileInfo::QFileInfo((QFileInfo *)local_108,(QFileInfo *)(local_e8 + 0x20));
      addNode(this_00,parentNode,(QString *)&local_b8,(QFileInfo *)local_108);
      QFileInfo::~QFileInfo((QFileInfo *)local_108);
    }
    local_108._0_8_ =
         QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::value
                   (&parentNode->children,(QString *)&local_b8);
    bVar2 = QFileSystemNode::caseSensitive(parentNode);
    if (bVar2) {
      bVar2 = ::operator!=((QString *)local_108._0_8_,(QString *)&local_b8);
      if (!bVar2) {
LAB_00571e8a:
        bVar2 = QFileSystemNode::operator!=
                          ((QFileSystemNode *)local_108._0_8_,(QExtendedInformation *)local_e8);
        if (bVar2) {
          QFileSystemNode::populate
                    ((QFileSystemNode *)local_108._0_8_,(QExtendedInformation *)local_e8);
          QHash<QFileSystemModelPrivate::QFileSystemNode_const*,bool>::
          removeImpl<QFileSystemModelPrivate::QFileSystemNode_const*>
                    ((QHash<QFileSystemModelPrivate::QFileSystemNode_const*,bool> *)
                     &this->bypassFilters,(QFileSystemNode **)local_108);
          bVar2 = filtersAcceptsNode(this,(QFileSystemNode *)local_108._0_8_);
          if (bVar2) {
            if (*(bool *)(local_108._0_8_ + 0x4d) == false) {
              this_01 = &local_78;
            }
            else {
              this_01 = &local_58;
            }
            QList<QString>::emplaceBack<QString_const&>
                      ((QList<QString> *)this_01,(QString *)&local_b8);
          }
          else if (*(bool *)(local_108._0_8_ + 0x4d) != false) {
            iVar3 = QFileSystemNode::visibleLocation(parentNode,(QString *)&local_b8);
            removeVisibleFile(this,parentNode,iVar3);
          }
        }
      }
    }
    else {
      iVar3 = QString::compare((QString *)local_108._0_8_,(CaseSensitivity)&local_b8);
      if (iVar3 == 0) {
        QString::operator=((QString *)local_108._0_8_,(QString *)&local_b8);
        goto LAB_00571e8a;
      }
    }
    QExtendedInformation::~QExtendedInformation((QExtendedInformation *)local_e8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    ppVar8 = ppVar8 + 1;
    lVar10 = lVar10 + -0x20;
  } while( true );
}

Assistant:

void QFileSystemModelPrivate::fileSystemChanged(const QString &path,
                                                   const QList<std::pair<QString, QFileInfo>> &updates)
{
#if QT_CONFIG(filesystemwatcher)
    Q_Q(QFileSystemModel);
    QList<QString> rowsToUpdate;
    QStringList newFiles;
    QFileSystemModelPrivate::QFileSystemNode *parentNode = node(path, false);
    QModelIndex parentIndex = index(parentNode);
    for (const auto &update : updates) {
        QString fileName = update.first;
        Q_ASSERT(!fileName.isEmpty());
        QExtendedInformation info = fileInfoGatherer->getInfo(update.second);
        bool previouslyHere = parentNode->children.contains(fileName);
        if (!previouslyHere) {
#ifdef Q_OS_WIN
            chopSpaceAndDot(fileName);
            if (fileName.isEmpty())
                continue;
#endif
            addNode(parentNode, fileName, info.fileInfo());
        }
        QFileSystemModelPrivate::QFileSystemNode * node = parentNode->children.value(fileName);
        bool isCaseSensitive = parentNode->caseSensitive();
        if (isCaseSensitive) {
            if (node->fileName != fileName)
                continue;
        } else {
            if (QString::compare(node->fileName,fileName,Qt::CaseInsensitive) != 0)
                continue;
        }
        if (isCaseSensitive) {
            Q_ASSERT(node->fileName == fileName);
        } else {
            node->fileName = fileName;
        }

        if (*node != info ) {
            node->populate(info);
            bypassFilters.remove(node);
            // brand new information.
            if (filtersAcceptsNode(node)) {
                if (!node->isVisible) {
                    newFiles.append(fileName);
                } else {
                    rowsToUpdate.append(fileName);
                }
            } else {
                if (node->isVisible) {
                    int visibleLocation = parentNode->visibleLocation(fileName);
                    removeVisibleFile(parentNode, visibleLocation);
                } else {
                    // The file is not visible, don't do anything
                }
            }
        }
    }

    // bundle up all of the changed signals into as few as possible.
    std::sort(rowsToUpdate.begin(), rowsToUpdate.end());
    QString min;
    QString max;
    for (const QString &value : std::as_const(rowsToUpdate)) {
        //##TODO is there a way to bundle signals with QString as the content of the list?
        /*if (min.isEmpty()) {
            min = value;
            if (i != rowsToUpdate.count() - 1)
                continue;
        }
        if (i != rowsToUpdate.count() - 1) {
            if ((value == min + 1 && max.isEmpty()) || value == max + 1) {
                max = value;
                continue;
            }
        }*/
        max = value;
        min = value;
        int visibleMin = parentNode->visibleLocation(min);
        int visibleMax = parentNode->visibleLocation(max);
        if (visibleMin >= 0
            && visibleMin < parentNode->visibleChildren.size()
            && parentNode->visibleChildren.at(visibleMin) == min
            && visibleMax >= 0) {
            // don't use NumColumns here, a subclass might override columnCount
            const int lastColumn = q->columnCount(parentIndex) - 1;
            const QModelIndex top = q->index(translateVisibleLocation(parentNode, visibleMin),
                                             QFileSystemModelPrivate::NameColumn, parentIndex);
            const QModelIndex bottom = q->index(translateVisibleLocation(parentNode, visibleMax),
                                                lastColumn, parentIndex);
            // We document that emitting dataChanged with indexes that don't have the
            // same parent is undefined behavior.
            Q_ASSERT(bottom.parent() == top.parent());
            emit q->dataChanged(top, bottom);
        }

        /*min = QString();
        max = QString();*/
    }

    if (newFiles.size() > 0) {
        addVisibleFiles(parentNode, newFiles);
    }

    if (newFiles.size() > 0 || (sortColumn != 0 && rowsToUpdate.size() > 0)) {
        forceSort = true;
        delayedSort();
    }
#else
    Q_UNUSED(path);
    Q_UNUSED(updates);
#endif // filesystemwatcher
}